

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O3

TPZSavable * __thiscall
TPZRestoreClass<TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_>_>::Restore
          (TPZRestoreClass<TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_>_> *this)

{
  TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_> *this_00;
  
  this_00 = (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_> *)operator_new(0x170);
  TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoLinear>_>::TPZGeoElMapped(this_00);
  return (TPZSavable *)
         ((long)(this_00->super_TPZGeoElRefPattern<pzgeom::TPZGeoLinear>).
                super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>.fGeo.
                super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes +
         *(long *)(*(long *)&(this_00->super_TPZGeoElRefPattern<pzgeom::TPZGeoLinear>).
                             super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>.super_TPZGeoEl + -0x60) +
         -0x48);
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }